

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcGen.c
# Opt level: O0

void Abc_GenFsmCond(Vec_Str_t *vCond,int nPis,int Prob)

{
  uint uVar1;
  undefined4 local_1c;
  int Rand;
  int i;
  int Prob_local;
  int nPis_local;
  Vec_Str_t *vCond_local;
  
  Vec_StrClear(vCond);
  for (local_1c = 0; local_1c < nPis; local_1c = local_1c + 1) {
    uVar1 = Aig_ManRandom(0);
    if (Prob < (int)uVar1 % 100) {
      Vec_StrPush(vCond,'-');
    }
    else if ((uVar1 & 1) == 0) {
      Vec_StrPush(vCond,'0');
    }
    else {
      Vec_StrPush(vCond,'1');
    }
  }
  Vec_StrPush(vCond,'\0');
  return;
}

Assistant:

void Abc_GenFsmCond( Vec_Str_t * vCond, int nPis, int Prob )
{
    int i, Rand;
    Vec_StrClear( vCond );
    for ( i = 0; i < nPis; i++ )
    {
        Rand = Aig_ManRandom( 0 );
        if ( Rand % 100 > Prob )
            Vec_StrPush( vCond, '-' );
        else if ( Rand & 1 )
            Vec_StrPush( vCond, '1' );
        else
            Vec_StrPush( vCond, '0' );
    }
    Vec_StrPush( vCond, '\0' );
}